

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void __thiscall ImGuiIO::AddMouseWheelEvent(ImGuiIO *this,float wheel_x,float wheel_y)

{
  ImGuiInputEvent e;
  ImGuiInputEvent local_18;
  
  if (this->AppAcceptingEvents == true) {
    if ((((wheel_x != 0.0) || (NAN(wheel_x))) || (wheel_y != 0.0)) || (NAN(wheel_y))) {
      local_18._16_8_ = 0;
      local_18.Type = ImGuiInputEventType_MouseWheel;
      local_18.Source = ImGuiInputSource_Mouse;
      local_18.field_2.MousePos.PosX = wheel_x;
      local_18.field_2.MousePos.PosY = wheel_y;
      ImVector<ImGuiInputEvent>::push_back(&GImGui->InputEventsQueue,&local_18);
      return;
    }
  }
  return;
}

Assistant:

void ImGuiIO::AddMouseWheelEvent(float wheel_x, float wheel_y)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(&g.IO == this && "Can only add events to current context.");

    // Filter duplicate (unlike most events, wheel values are relative and easy to filter)
    if (!AppAcceptingEvents || (wheel_x == 0.0f && wheel_y == 0.0f))
        return;

    ImGuiInputEvent e;
    e.Type = ImGuiInputEventType_MouseWheel;
    e.Source = ImGuiInputSource_Mouse;
    e.MouseWheel.WheelX = wheel_x;
    e.MouseWheel.WheelY = wheel_y;
    g.InputEventsQueue.push_back(e);
}